

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeightsAxisProjected
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  LineInterpolationRange *returnValue;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar18;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 uVar31;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vec2 VVar19;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar37;
  undefined4 uVar50;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined8 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined4 uVar63;
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  LineInterpolationRange LVar93;
  Vec2 VVar13;
  undefined1 auVar42 [16];
  undefined1 auVar48 [16];
  undefined1 auVar62 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  
  auVar64._0_4_ = (float)*(undefined8 *)pb->m_data - (float)*(undefined8 *)pa->m_data;
  auVar64._4_4_ =
       (float)((ulong)*(undefined8 *)pb->m_data >> 0x20) -
       (float)((ulong)*(undefined8 *)pa->m_data >> 0x20);
  auVar64._8_8_ = 0;
  uVar3 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
  auVar32._0_8_ = uVar3 ^ 0x8000000080000000;
  auVar32._8_4_ = 0x80000000;
  auVar32._12_4_ = 0x80000000;
  auVar32 = maxps(auVar32,auVar64);
  bVar1 = auVar32._0_4_ < auVar32._4_4_;
  auVar49._0_4_ = pr->m_data[bVar1] - pa->m_data[bVar1];
  if (ABS(auVar49._0_4_) == INFINITY) {
    auVar49._4_4_ = auVar49._0_4_;
    auVar49._8_4_ = auVar49._0_4_;
    auVar49._12_4_ = auVar49._0_4_;
  }
  else {
    fVar36 = (float)((uint)auVar49._0_4_ & 0x7f800000);
    fVar4 = 1.1754944e-38;
    if (((uint)auVar49._0_4_ & 0x7fffff) == 0) {
      fVar4 = fVar36;
    }
    if (fVar36 != 0.0) {
      fVar4 = fVar36;
    }
    fVar4 = (float)((int)fVar4 + 0x2000) - fVar4;
    fVar36 = auVar49._0_4_ + fVar4;
    auVar49._0_4_ = auVar49._0_4_ - fVar4;
    auVar49._4_4_ = fVar36;
    auVar49._8_8_ = 0;
  }
  fVar36 = pb->m_data[bVar1] - pa->m_data[bVar1];
  fVar4 = fVar36;
  if (ABS(fVar36) != INFINITY) {
    fVar4 = (float)((uint)fVar36 & 0x7f800000);
    fVar5 = 1.1754944e-38;
    if (((uint)fVar36 & 0x7fffff) == 0) {
      fVar5 = fVar4;
    }
    if (fVar4 != 0.0) {
      fVar5 = fVar4;
    }
    fVar5 = (float)((int)fVar5 + 0x2000) - fVar5;
    fVar4 = fVar36 - fVar5;
    fVar36 = fVar36 + fVar5;
  }
  auVar54._0_12_ = ZEXT812(0);
  auVar54._12_4_ = 0;
  bVar1 = auVar49._0_4_ != 0.0;
  bVar2 = auVar49._4_4_ != 0.0;
  if (bVar2 || bVar1) {
    if ((fVar36 < 0.0) || (0.0 < fVar4)) {
      auVar52._4_4_ = fVar4;
      auVar52._0_4_ = fVar4;
      auVar52._8_4_ = fVar4;
      auVar52._12_4_ = fVar4;
      auVar32 = divps(auVar49,auVar52);
      auVar53._4_4_ = fVar36;
      auVar53._0_4_ = fVar36;
      auVar53._8_4_ = fVar36;
      auVar53._12_4_ = fVar36;
      auVar64 = divps(auVar49,auVar53);
      uVar9 = -(uint)(auVar64._0_4_ <= auVar32._0_4_);
      uVar10 = -(uint)(auVar64._4_4_ <= auVar32._4_4_);
      uVar11 = -(uint)(auVar64._8_4_ <= auVar32._8_4_);
      uVar12 = -(uint)(auVar64._12_4_ <= auVar32._12_4_);
      fVar5 = (float)(~uVar9 & (uint)auVar64._0_4_ | (uint)auVar32._0_4_ & uVar9);
      auVar90._4_4_ = (float)(~uVar10 & (uint)auVar64._4_4_ | (uint)auVar32._4_4_ & uVar10);
      uVar9 = -(uint)(auVar90._4_4_ <= fVar5);
      auVar90._0_4_ = (uint)fVar5 & uVar9;
      auVar90._8_4_ =
           (~uVar11 & (uint)auVar64._8_4_ | (uint)auVar32._8_4_ & uVar11) & (uint)auVar90._4_4_;
      auVar90._12_4_ =
           (~uVar12 & (uint)auVar64._12_4_ | (uint)auVar32._12_4_ & uVar12) & (uint)auVar90._4_4_;
      auVar54 = ZEXT416(~uVar9 & (uint)auVar90._4_4_) | auVar90;
    }
    else {
      auVar54._0_12_ = ZEXT812(0x7f800000);
      auVar54._12_4_ = 0;
    }
  }
  uVar38 = auVar54._0_8_;
  fVar5 = auVar54._0_4_;
  if (ABS(fVar5) != INFINITY) {
    fVar37 = 1.1754944e-38;
    if ((auVar54 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar37 = (float)((uint)fVar5 & 0x7f800000);
    }
    if ((auVar54 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar37 = (float)((uint)fVar5 & 0x7f800000);
    }
    auVar55._4_12_ = auVar54._4_12_;
    auVar55._0_4_ = fVar5 + ((float)((int)fVar37 + 0x6000) - fVar37);
    uVar38 = auVar55._0_8_;
  }
  auVar66 = ZEXT816(0);
  if (bVar2 || bVar1) {
    if ((fVar36 < 0.0) || (0.0 < fVar4)) {
      auVar71._4_4_ = fVar4;
      auVar71._0_4_ = fVar4;
      auVar71._8_4_ = fVar4;
      auVar71._12_4_ = fVar4;
      auVar64 = divps(auVar49,auVar71);
      auVar39._4_4_ = fVar36;
      auVar39._0_4_ = fVar36;
      auVar39._8_4_ = fVar36;
      auVar39._12_4_ = fVar36;
      auVar32 = divps(auVar49,auVar39);
      uVar9 = -(uint)(auVar64._0_4_ <= auVar32._0_4_);
      uVar10 = -(uint)(auVar64._4_4_ <= auVar32._4_4_);
      uVar11 = -(uint)(auVar64._8_4_ <= auVar32._8_4_);
      uVar12 = -(uint)(auVar64._12_4_ <= auVar32._12_4_);
      fVar4 = (float)(~uVar9 & (uint)auVar32._0_4_ | (uint)auVar64._0_4_ & uVar9);
      auVar40._4_4_ = (float)(~uVar10 & (uint)auVar32._4_4_ | (uint)auVar64._4_4_ & uVar10);
      auVar40._8_4_ = ~uVar11 & (uint)auVar32._8_4_ | (uint)auVar64._8_4_ & uVar11;
      auVar40._12_4_ = ~uVar12 & (uint)auVar32._12_4_ | (uint)auVar64._12_4_ & uVar12;
      uVar9 = -(uint)(fVar4 <= auVar40._4_4_);
      auVar40._0_4_ = (uint)fVar4 & uVar9;
      auVar65._0_4_ = ~uVar9 & (uint)auVar40._4_4_;
      auVar65._4_4_ = 0;
      auVar65._8_4_ = ~auVar40._8_4_ & (uint)auVar40._4_4_;
      auVar65._12_4_ = ~auVar40._12_4_ & (uint)auVar40._4_4_;
      auVar66 = auVar65 | auVar40;
    }
    else {
      auVar66._0_12_ = ZEXT812(0xff800000);
      auVar66._12_4_ = 0;
    }
  }
  uVar18 = auVar66._0_8_;
  fVar4 = auVar66._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar36 = 1.1754944e-38;
    if ((auVar66 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar36 = (float)((uint)fVar4 & 0x7f800000);
    }
    if ((auVar66 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar36 = (float)((uint)fVar4 & 0x7f800000);
    }
    auVar67._4_12_ = auVar66._4_12_;
    auVar67._0_4_ = fVar4 - ((float)((int)fVar36 + 0x6000) - fVar36);
    uVar18 = auVar67._0_8_;
  }
  auVar34._0_12_ = ZEXT812(0);
  auVar34._12_4_ = 0;
  fVar5 = (float)uVar18;
  fVar37 = (float)((ulong)uVar18 >> 0x20);
  fVar4 = (float)uVar38;
  fVar36 = (float)((ulong)uVar38 >> 0x20);
  if (fVar4 != 0.0 || fVar5 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      auVar42._8_4_ = fVar37;
      auVar42._0_8_ = uVar18;
      auVar42._12_4_ = fVar36;
      auVar41._8_8_ = auVar42._8_8_;
      auVar41._4_4_ = fVar4;
      auVar41._0_4_ = fVar5;
      auVar33._4_4_ = wb;
      auVar33._0_4_ = wb;
      auVar33._8_4_ = wb;
      auVar33._12_4_ = wb;
      auVar32 = divps(auVar41,auVar33);
      auVar43._4_4_ = auVar32._4_4_;
      uVar9 = -(uint)(auVar43._4_4_ <= auVar32._0_4_);
      auVar43._0_4_ = (uint)auVar32._0_4_ & uVar9;
      auVar43._8_4_ = auVar32._8_4_ & (uint)auVar43._4_4_;
      auVar43._12_4_ = auVar32._12_4_ & (uint)auVar43._4_4_;
      auVar34 = ZEXT416(~uVar9 & (uint)auVar43._4_4_) | auVar43;
    }
    else {
      auVar34._0_12_ = ZEXT812(0x7f800000);
      auVar34._12_4_ = 0;
    }
  }
  fVar6 = auVar34._0_4_;
  if (ABS(fVar6) != INFINITY) {
    fVar8 = 1.1754944e-38;
    if ((auVar34 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar8 = (float)((uint)fVar6 & 0x7f800000);
    }
    if ((auVar34 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar8 = (float)((uint)fVar6 & 0x7f800000);
    }
    auVar34._0_4_ = fVar6 + ((float)((int)fVar8 + 0x6000) - fVar8);
  }
  auVar45 = ZEXT816(0);
  if (fVar4 != 0.0 || fVar5 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      auVar73._8_4_ = fVar37;
      auVar73._0_8_ = uVar18;
      auVar73._12_4_ = fVar36;
      auVar72._8_8_ = auVar73._8_8_;
      auVar72._4_4_ = fVar4;
      auVar72._0_4_ = fVar5;
      auVar20._4_4_ = wb;
      auVar20._0_4_ = wb;
      auVar20._8_4_ = wb;
      auVar20._12_4_ = wb;
      auVar32 = divps(auVar72,auVar20);
      auVar74._4_4_ = auVar32._4_4_;
      auVar74._8_4_ = auVar32._8_4_;
      auVar74._12_4_ = auVar32._12_4_;
      uVar9 = -(uint)(auVar32._0_4_ <= auVar74._4_4_);
      auVar74._0_4_ = (uint)auVar32._0_4_ & uVar9;
      auVar44._0_4_ = ~uVar9 & (uint)auVar74._4_4_;
      auVar44._4_4_ = 0;
      auVar44._8_4_ = ~auVar74._8_4_ & (uint)auVar74._4_4_;
      auVar44._12_4_ = ~auVar74._12_4_ & (uint)auVar74._4_4_;
      auVar45 = auVar44 | auVar74;
    }
    else {
      auVar45._0_12_ = ZEXT812(0xff800000);
      auVar45._12_4_ = 0;
    }
  }
  uVar38 = auVar45._0_8_;
  fVar6 = auVar45._0_4_;
  if (ABS(fVar6) != INFINITY) {
    fVar8 = 1.1754944e-38;
    if ((auVar45 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar8 = (float)((uint)fVar6 & 0x7f800000);
    }
    if ((auVar45 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar8 = (float)((uint)fVar6 & 0x7f800000);
    }
    auVar46._4_12_ = auVar45._4_12_;
    auVar46._0_4_ = fVar6 - ((float)((int)fVar8 + 0x6000) - fVar8);
    uVar38 = auVar46._0_8_;
  }
  fVar4 = 1.0 - fVar4;
  fVar5 = 1.0 - fVar5;
  auVar68._0_8_ = CONCAT44(fVar5,fVar4);
  auVar68._8_4_ = 0.0 - fVar36;
  auVar68._12_4_ = 0.0 - fVar37;
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  if (fVar5 != 0.0 || fVar4 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      auVar21._4_4_ = wa;
      auVar21._0_4_ = wa;
      auVar21._8_4_ = wa;
      auVar21._12_4_ = wa;
      auVar56._8_4_ = auVar68._8_4_;
      auVar56._0_8_ = auVar68._0_8_;
      auVar56._12_4_ = auVar68._12_4_;
      auVar32 = divps(auVar56,auVar21);
      auVar57._4_4_ = auVar32._4_4_;
      uVar9 = -(uint)(auVar57._4_4_ <= auVar32._0_4_);
      auVar57._0_4_ = (uint)auVar32._0_4_ & uVar9;
      auVar57._8_4_ = auVar32._8_4_ & (uint)auVar57._4_4_;
      auVar57._12_4_ = auVar32._12_4_ & (uint)auVar57._4_4_;
      auVar22 = ZEXT416(~uVar9 & (uint)auVar57._4_4_) | auVar57;
    }
    else {
      auVar22._0_12_ = ZEXT812(0x7f800000);
      auVar22._12_4_ = 0;
    }
  }
  uVar18 = auVar22._0_8_;
  fVar36 = auVar22._0_4_;
  if (ABS(fVar36) != INFINITY) {
    fVar37 = 1.1754944e-38;
    if ((auVar22 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar37 = (float)((uint)fVar36 & 0x7f800000);
    }
    if ((auVar22 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar37 = (float)((uint)fVar36 & 0x7f800000);
    }
    auVar23._4_12_ = auVar22._4_12_;
    auVar23._0_4_ = fVar36 + ((float)((int)fVar37 + 0x6000) - fVar37);
    uVar18 = auVar23._0_8_;
  }
  auVar59 = ZEXT816(0);
  if (fVar5 != 0.0 || fVar4 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      auVar14._4_4_ = wa;
      auVar14._0_4_ = wa;
      auVar14._8_4_ = wa;
      auVar14._12_4_ = wa;
      auVar32 = divps(auVar68,auVar14);
      auVar69._4_4_ = auVar32._4_4_;
      auVar69._8_4_ = auVar32._8_4_;
      auVar69._12_4_ = auVar32._12_4_;
      uVar9 = -(uint)(auVar32._0_4_ <= auVar69._4_4_);
      auVar69._0_4_ = (uint)auVar32._0_4_ & uVar9;
      auVar58._0_4_ = ~uVar9 & (uint)auVar69._4_4_;
      auVar58._4_4_ = 0;
      auVar58._8_4_ = ~auVar69._8_4_ & (uint)auVar69._4_4_;
      auVar58._12_4_ = ~auVar69._12_4_ & (uint)auVar69._4_4_;
      auVar59 = auVar58 | auVar69;
    }
    else {
      auVar59._0_12_ = ZEXT812(0xff800000);
      auVar59._12_4_ = 0;
    }
  }
  uVar51 = auVar59._0_8_;
  fVar4 = auVar59._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar36 = 1.1754944e-38;
    if ((auVar59 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar36 = (float)((uint)fVar4 & 0x7f800000);
    }
    if ((auVar59 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar36 = (float)((uint)fVar4 & 0x7f800000);
    }
    auVar60._4_12_ = auVar59._4_12_;
    auVar60._0_4_ = fVar4 - ((float)((int)fVar36 + 0x6000) - fVar36);
    uVar51 = auVar60._0_8_;
  }
  fVar5 = auVar34._0_4_;
  uVar35 = auVar34._4_4_;
  auVar15._4_12_ = auVar34._4_12_;
  fVar36 = (float)uVar18;
  fVar4 = fVar5 + fVar36;
  if (ABS(fVar4) != INFINITY) {
    fVar6 = (float)((uint)fVar4 & 0x7f800000);
    fVar37 = 1.1754944e-38;
    if (((uint)fVar4 & 0x7fffff) == 0) {
      fVar37 = fVar6;
    }
    if (fVar6 != 0.0) {
      fVar37 = fVar6;
    }
    fVar4 = fVar4 + ((float)((int)fVar37 + 0x2000) - fVar37);
  }
  auVar15._0_4_ = fVar4;
  VVar13.m_data = auVar15._0_8_;
  fVar37 = (float)uVar38;
  uVar50 = (undefined4)((ulong)uVar38 >> 0x20);
  auVar61._0_4_ = (float)uVar51;
  fVar6 = fVar37 + auVar61._0_4_;
  if (ABS(fVar6) != INFINITY) {
    fVar7 = (float)((uint)fVar6 & 0x7f800000);
    fVar8 = 1.1754944e-38;
    if (((uint)fVar6 & 0x7fffff) == 0) {
      fVar8 = fVar7;
    }
    if (fVar7 != 0.0) {
      fVar8 = fVar7;
    }
    fVar6 = fVar6 - ((float)((int)fVar8 + 0x2000) - fVar8);
  }
  auVar77._0_12_ = ZEXT812(0);
  auVar77._12_4_ = 0;
  uVar63 = (undefined4)((ulong)uVar51 >> 0x20);
  uVar31 = (undefined4)((ulong)uVar18 >> 0x20);
  if (fVar36 != 0.0 || auVar61._0_4_ != 0.0) {
    if ((fVar4 < 0.0) || (0.0 < fVar6)) {
      auVar76._8_4_ = uVar63;
      auVar76._0_8_ = uVar51;
      auVar76._12_4_ = uVar31;
      auVar75._8_8_ = auVar76._8_8_;
      auVar75._4_4_ = fVar36;
      auVar75._0_4_ = auVar61._0_4_;
      auVar84._4_4_ = fVar6;
      auVar84._0_4_ = fVar6;
      auVar84._8_4_ = fVar6;
      auVar84._12_4_ = fVar6;
      auVar91._4_4_ = fVar36;
      auVar91._0_4_ = auVar61._0_4_;
      auVar91._8_4_ = uVar63;
      auVar91._12_4_ = uVar31;
      auVar49 = divps(auVar91,auVar84);
      auVar85._4_4_ = fVar4;
      auVar85._0_4_ = fVar4;
      auVar85._8_4_ = fVar4;
      auVar85._12_4_ = fVar4;
      auVar32 = divps(auVar75,auVar85);
      uVar9 = -(uint)(auVar32._0_4_ <= auVar49._0_4_);
      uVar10 = -(uint)(auVar32._4_4_ <= auVar49._4_4_);
      uVar11 = -(uint)(auVar32._8_4_ <= auVar49._8_4_);
      uVar12 = -(uint)(auVar32._12_4_ <= auVar49._12_4_);
      fVar8 = (float)(~uVar9 & (uint)auVar32._0_4_ | (uint)auVar49._0_4_ & uVar9);
      auVar86._4_4_ = (float)(~uVar10 & (uint)auVar32._4_4_ | (uint)auVar49._4_4_ & uVar10);
      uVar9 = -(uint)(auVar86._4_4_ <= fVar8);
      auVar86._0_4_ = (uint)fVar8 & uVar9;
      auVar86._8_4_ =
           (~uVar11 & (uint)auVar32._8_4_ | (uint)auVar49._8_4_ & uVar11) & (uint)auVar86._4_4_;
      auVar86._12_4_ =
           (~uVar12 & (uint)auVar32._12_4_ | (uint)auVar49._12_4_ & uVar12) & (uint)auVar86._4_4_;
      auVar77 = ZEXT416(~uVar9 & (uint)auVar86._4_4_) | auVar86;
    }
    else {
      auVar77._0_12_ = ZEXT812(0x7f800000);
      auVar77._12_4_ = 0;
    }
  }
  fVar8 = auVar77._0_4_;
  if (ABS(fVar8) != INFINITY) {
    fVar7 = 1.1754944e-38;
    if ((auVar77 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar7 = (float)((uint)fVar8 & 0x7f800000);
    }
    if ((auVar77 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar7 = (float)((uint)fVar8 & 0x7f800000);
    }
    auVar77._0_4_ = fVar8 + ((float)((int)fVar7 + 0x6000) - fVar7);
  }
  *(int *)this = auVar77._0_4_;
  auVar80._0_12_ = ZEXT812(0);
  auVar80._12_4_ = 0;
  if (fVar37 != 0.0 || fVar5 != 0.0) {
    if ((fVar4 < 0.0) || (0.0 < fVar6)) {
      auVar79._8_4_ = uVar50;
      auVar79._0_8_ = uVar38;
      auVar79._12_4_ = uVar35;
      auVar78._8_8_ = auVar79._8_8_;
      auVar78._4_4_ = fVar5;
      auVar78._0_4_ = fVar37;
      auVar87._4_4_ = fVar6;
      auVar87._0_4_ = fVar6;
      auVar87._8_4_ = fVar6;
      auVar87._12_4_ = fVar6;
      auVar92._4_4_ = fVar5;
      auVar92._0_4_ = fVar37;
      auVar92._8_4_ = uVar50;
      auVar92._12_4_ = uVar35;
      auVar49 = divps(auVar92,auVar87);
      auVar88._4_4_ = fVar4;
      auVar88._0_4_ = fVar4;
      auVar88._8_4_ = fVar4;
      auVar88._12_4_ = fVar4;
      auVar32 = divps(auVar78,auVar88);
      uVar9 = -(uint)(auVar32._0_4_ <= auVar49._0_4_);
      uVar10 = -(uint)(auVar32._4_4_ <= auVar49._4_4_);
      uVar11 = -(uint)(auVar32._8_4_ <= auVar49._8_4_);
      uVar12 = -(uint)(auVar32._12_4_ <= auVar49._12_4_);
      fVar8 = (float)(~uVar9 & (uint)auVar32._0_4_ | (uint)auVar49._0_4_ & uVar9);
      auVar89._4_4_ = (float)(~uVar10 & (uint)auVar32._4_4_ | (uint)auVar49._4_4_ & uVar10);
      uVar9 = -(uint)(auVar89._4_4_ <= fVar8);
      auVar89._0_4_ = (uint)fVar8 & uVar9;
      auVar89._8_4_ =
           (~uVar11 & (uint)auVar32._8_4_ | (uint)auVar49._8_4_ & uVar11) & (uint)auVar89._4_4_;
      auVar89._12_4_ =
           (~uVar12 & (uint)auVar32._12_4_ | (uint)auVar49._12_4_ & uVar12) & (uint)auVar89._4_4_;
      auVar80 = ZEXT416(~uVar9 & (uint)auVar89._4_4_) | auVar89;
    }
    else {
      auVar80._0_12_ = ZEXT812(0x7f800000);
      auVar80._12_4_ = 0;
    }
  }
  fVar8 = auVar80._0_4_;
  if (ABS(fVar8) != INFINITY) {
    fVar7 = 1.1754944e-38;
    if ((auVar80 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar7 = (float)((uint)fVar8 & 0x7f800000);
    }
    if ((auVar80 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar7 = (float)((uint)fVar8 & 0x7f800000);
    }
    auVar80._0_4_ = fVar8 + ((float)((int)fVar7 + 0x6000) - fVar7);
  }
  *(int *)(this + 4) = auVar80._0_4_;
  auVar83 = ZEXT816(0);
  if (fVar36 != 0.0 || auVar61._0_4_ != 0.0) {
    if ((fVar4 < 0.0) || (0.0 < fVar6)) {
      auVar62._8_4_ = uVar63;
      auVar62._0_8_ = uVar51;
      auVar62._12_4_ = uVar31;
      auVar61._8_8_ = auVar62._8_8_;
      auVar61._4_4_ = fVar36;
      auVar24._4_4_ = fVar6;
      auVar24._0_4_ = fVar6;
      auVar24._8_4_ = fVar6;
      auVar24._12_4_ = fVar6;
      auVar81._4_4_ = fVar36;
      auVar81._0_4_ = auVar61._0_4_;
      auVar81._8_4_ = uVar63;
      auVar81._12_4_ = uVar31;
      auVar49 = divps(auVar81,auVar24);
      auVar25._4_4_ = fVar4;
      auVar25._0_4_ = fVar4;
      auVar25._8_4_ = fVar4;
      auVar25._12_4_ = fVar4;
      auVar32 = divps(auVar61,auVar25);
      uVar9 = -(uint)(auVar49._0_4_ <= auVar32._0_4_);
      uVar10 = -(uint)(auVar49._4_4_ <= auVar32._4_4_);
      uVar11 = -(uint)(auVar49._8_4_ <= auVar32._8_4_);
      uVar12 = -(uint)(auVar49._12_4_ <= auVar32._12_4_);
      fVar36 = (float)(~uVar9 & (uint)auVar32._0_4_ | (uint)auVar49._0_4_ & uVar9);
      auVar26._4_4_ = (float)(~uVar10 & (uint)auVar32._4_4_ | (uint)auVar49._4_4_ & uVar10);
      auVar26._8_4_ = ~uVar11 & (uint)auVar32._8_4_ | (uint)auVar49._8_4_ & uVar11;
      auVar26._12_4_ = ~uVar12 & (uint)auVar32._12_4_ | (uint)auVar49._12_4_ & uVar12;
      uVar9 = -(uint)(fVar36 <= auVar26._4_4_);
      auVar26._0_4_ = (uint)fVar36 & uVar9;
      auVar82._0_4_ = ~uVar9 & (uint)auVar26._4_4_;
      auVar82._4_4_ = 0;
      auVar82._8_4_ = ~auVar26._8_4_ & (uint)auVar26._4_4_;
      auVar82._12_4_ = ~auVar26._12_4_ & (uint)auVar26._4_4_;
      auVar83 = auVar82 | auVar26;
    }
    else {
      auVar83._0_12_ = ZEXT812(0xff800000);
      auVar83._12_4_ = 0;
    }
  }
  fVar36 = auVar83._0_4_;
  if (ABS(fVar36) != INFINITY) {
    fVar8 = 1.1754944e-38;
    if ((auVar83 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar8 = (float)((uint)fVar36 & 0x7f800000);
    }
    if ((auVar83 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar8 = (float)((uint)fVar36 & 0x7f800000);
    }
    auVar83._0_4_ = fVar36 - ((float)((int)fVar8 + 0x6000) - fVar8);
  }
  *(int *)(this + 8) = auVar83._0_4_;
  auVar29 = ZEXT816(0);
  if (fVar37 != 0.0 || fVar5 != 0.0) {
    if ((fVar4 < 0.0) || (0.0 < fVar6)) {
      auVar48._8_4_ = uVar50;
      auVar48._0_8_ = uVar38;
      auVar48._12_4_ = uVar35;
      auVar47._8_8_ = auVar48._8_8_;
      auVar47._0_8_ = CONCAT44(fVar5,fVar37);
      auVar70._4_4_ = fVar6;
      auVar70._0_4_ = fVar6;
      auVar70._8_4_ = fVar6;
      auVar70._12_4_ = fVar6;
      auVar27._8_4_ = uVar50;
      auVar27._0_8_ = auVar47._0_8_;
      auVar27._12_4_ = uVar35;
      auVar32 = divps(auVar27,auVar70);
      auVar16._4_4_ = fVar4;
      auVar16._0_4_ = fVar4;
      auVar16._8_4_ = fVar4;
      auVar16._12_4_ = fVar4;
      auVar49 = divps(auVar47,auVar16);
      uVar9 = -(uint)(auVar32._0_4_ <= auVar49._0_4_);
      uVar10 = -(uint)(auVar32._4_4_ <= auVar49._4_4_);
      uVar11 = -(uint)(auVar32._8_4_ <= auVar49._8_4_);
      uVar12 = -(uint)(auVar32._12_4_ <= auVar49._12_4_);
      fVar4 = (float)(~uVar9 & (uint)auVar49._0_4_ | (uint)auVar32._0_4_ & uVar9);
      VVar13.m_data[1] = (float)(~uVar10 & (uint)auVar49._4_4_ | (uint)auVar32._4_4_ & uVar10);
      auVar17._8_4_ = ~uVar11 & (uint)auVar49._8_4_ | (uint)auVar32._8_4_ & uVar11;
      auVar17._12_4_ = ~uVar12 & (uint)auVar49._12_4_ | (uint)auVar32._12_4_ & uVar12;
      uVar9 = -(uint)(fVar4 <= VVar13.m_data[1]);
      VVar13.m_data[0] = (float)((uint)fVar4 & uVar9);
      auVar17._0_4_ = VVar13.m_data[0];
      auVar17._4_4_ = VVar13.m_data[1];
      auVar28._0_4_ = ~uVar9 & (uint)VVar13.m_data[1];
      auVar28._4_4_ = 0;
      auVar28._8_4_ = ~auVar17._8_4_ & (uint)VVar13.m_data[1];
      auVar28._12_4_ = ~auVar17._12_4_ & (uint)VVar13.m_data[1];
      auVar29 = auVar28 | auVar17;
    }
    else {
      auVar29._0_12_ = ZEXT812(0xff800000);
      auVar29._12_4_ = 0;
    }
  }
  VVar19.m_data = auVar29._0_8_;
  fVar4 = auVar29._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar36 = 1.1754944e-38;
    if ((auVar29 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar36 = (float)((uint)fVar4 & 0x7f800000);
    }
    if ((auVar29 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar36 = (float)((uint)fVar4 & 0x7f800000);
    }
    VVar13.m_data[0] = (float)((int)fVar36 + 0x6000) - fVar36;
    VVar13.m_data[1] = 0.0;
    auVar30._4_12_ = auVar29._4_12_;
    auVar30._0_4_ = fVar4 - VVar13.m_data[0];
    VVar19.m_data = auVar30._0_8_;
  }
  *(float *)(this + 0xc) = VVar19.m_data[0];
  LVar93.min.m_data[0] = VVar19.m_data[0];
  LVar93.min.m_data[1] = VVar19.m_data[1];
  LVar93.max.m_data[0] = VVar13.m_data[0];
  LVar93.max.m_data[1] = VVar13.m_data[1];
  return LVar93;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeightsAxisProjected (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int	roundError		= 1;
	const int	divError		= 3;
	const bool	isXMajor		= isLineXMajor(pa, pb);
	const int	majorAxisNdx	= (isXMajor) ? (0) : (1);

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Use axis projected (inaccurate) method, i.e. for X-major lines:
	//     (xd - xa) * (xb - xa)      xd - xa
	// t = ---------------------  ==  -------
	//       ( xb - xa ) ^ 2          xb - xa

	// Allow 1 ULP
	const float		dividend	= (pr[majorAxisNdx] - pa[majorAxisNdx]);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Allow 1 ULP
	const float		divisor		= (pb[majorAxisNdx] - pa[majorAxisNdx]);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}